

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O0

void __thiscall glu::Shader::Shader(Shader *this,RenderContext *renderCtx,ShaderType shaderType)

{
  glCreateShaderFunc p_Var1;
  int iVar2;
  deUint32 dVar3;
  GLuint GVar4;
  GLenum err;
  deBool dVar5;
  undefined4 extraout_var;
  TestError *this_00;
  ShaderType shaderType_local;
  RenderContext *renderCtx_local;
  Shader *this_local;
  
  iVar2 = (*renderCtx->_vptr_RenderContext[3])();
  this->m_gl = (Functions *)CONCAT44(extraout_var,iVar2);
  this->m_shader = 0;
  ShaderInfo::ShaderInfo(&this->m_info);
  (this->m_info).type = shaderType;
  p_Var1 = this->m_gl->createShader;
  dVar3 = getGLShaderType(shaderType);
  GVar4 = (*p_Var1)(dVar3);
  this->m_shader = GVar4;
  err = (*this->m_gl->getError)();
  checkError(err,"glCreateShader()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluShaderProgram.cpp"
             ,0x2e);
  while( true ) {
    dVar5 = ::deGetFalse();
    if ((dVar5 != 0) || (this->m_shader == 0)) break;
    dVar5 = ::deGetFalse();
    if (dVar5 == 0) {
      return;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"m_shader",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluShaderProgram.cpp"
             ,0x2f);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

Shader::Shader (const RenderContext& renderCtx, ShaderType shaderType)
	: m_gl		(renderCtx.getFunctions())
	, m_shader	(0)
{
	m_info.type	= shaderType;
	m_shader	= m_gl.createShader(getGLShaderType(shaderType));
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCreateShader()");
	TCU_CHECK(m_shader);
}